

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

void __thiscall slack::_detail::Slacking::trigger_error(Slacking *this,string *msg)

{
  runtime_error *this_00;
  ostream *poVar1;
  string *msg_local;
  Slacking *this_local;
  
  if ((this->throw_exception_ & 1U) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(string *)msg);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"[slacking] error. Reason: ");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void trigger_error(const std::string& msg) {
        if (throw_exception_) 
            throw std::runtime_error(msg);
        else 
            std::cerr << "[slacking] error. Reason: " << msg << '\n';
    }